

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::AfterIfTrueExpr
          (ExprVisitorDelegate *this,IfExpr *expr)

{
  int iVar1;
  WatWriter *pWVar2;
  Info local_60;
  
  if ((expr->false_).size_ != 0) {
    pWVar2 = this->writer_;
    iVar1 = pWVar2->indent_;
    pWVar2->indent_ = iVar1 + -2;
    if (iVar1 < 2) {
      __assert_fail("indent_ >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wat-writer.cc"
                    ,0xd2,"void wabt::(anonymous namespace)::WatWriter::Dedent()");
    }
    Opcode::GetInfo(&local_60,(Opcode *)&Opcode::Else_Opcode);
    WritePuts(pWVar2,local_60.name,Space);
    pWVar2 = this->writer_;
    pWVar2->indent_ = pWVar2->indent_ + 2;
    if (pWVar2->next_char_ == ForceNewline) {
      WriteNextChar(pWVar2);
    }
    pWVar2->next_char_ = ForceNewline;
  }
  return (Result)Ok;
}

Assistant:

void WatWriter::WriteVarUnlessZero(const Var& var, NextChar next_char) {
  if (!VarIsZero(var)) {
    WriteVar(var, next_char);
  }
}